

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_0::Btree_ExtractTracking_Test::~Btree_ExtractTracking_Test
          (Btree_ExtractTracking_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Btree, ExtractTracking) {
        TestExtractWithTrackingForSet<phmap::btree_set<MovableOnlyInstance>>();
        TestExtractWithTrackingForSet<phmap::btree_multiset<MovableOnlyInstance>>();
        TestExtractWithTrackingForMap<
            phmap::btree_map<CopyableMovableInstance, MovableOnlyInstance>>();
        TestExtractWithTrackingForMap<
            phmap::btree_multimap<CopyableMovableInstance, MovableOnlyInstance>>();
    }